

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O3

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  void **ppvVar23;
  int iVar24;
  ulong uVar25;
  void **ppvVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  undefined2 *puVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined2 *puVar41;
  long lVar42;
  long lVar43;
  long local_2a8;
  ulong local_2a0;
  long local_270;
  long local_1e8;
  Mat *local_1d0;
  
  if (0 < batch) {
    iVar14 = max_kk * batch;
    pvVar2 = AT->data;
    iVar1 = AT->w;
    sVar3 = AT->elemsize;
    lVar38 = (long)iVar14;
    iVar15 = iVar14 + batch;
    lVar42 = (long)(iVar14 * 2);
    iVar16 = batch + iVar14 * 2;
    lVar43 = (long)(iVar14 * 3);
    iVar17 = iVar14 * 3 + batch;
    lVar40 = (long)(iVar14 * 4);
    iVar28 = batch + iVar14 * 4;
    lVar29 = (long)(iVar14 * 5);
    iVar18 = iVar14 * 5 + batch;
    lVar20 = (long)(iVar14 * 6);
    iVar19 = iVar14 * 6 + batch;
    lVar33 = (long)(iVar14 * 7);
    iVar37 = iVar14 * 7 + batch;
    iVar4 = iVar14 * 9;
    iVar5 = iVar14 * 10;
    iVar11 = iVar14 * 0xb;
    iVar6 = iVar14 * 0xc;
    iVar12 = iVar14 * 0xd;
    iVar10 = iVar14 * 0xe;
    iVar7 = iVar14 * 0xf;
    uVar13 = (ulong)(uint)batch;
    uVar21 = max_kk & 0xfffffffe;
    lVar8 = (ulong)(uint)(batch * 2) * 2;
    lVar39 = (long)max_ii;
    lVar9 = lVar38 * 2;
    local_270 = 0;
    uVar27 = 0;
    local_1d0 = A;
    do {
      puVar41 = (undefined2 *)((long)iVar1 * sVar3 * uVar27 + (long)pvVar2);
      if (max_ii < 0x10) {
        uVar34 = 0;
      }
      else {
        local_2a8 = local_270;
        local_2a0 = 0;
        do {
          if (max_kk < 2) {
            uVar32 = 0;
            puVar31 = (undefined2 *)((long)&A->data + local_2a0 * lVar38 * 2 + uVar27 * 2);
          }
          else {
            iVar24 = 1;
            lVar30 = local_2a8;
            do {
              *puVar41 = *(undefined2 *)((long)&A->data + lVar30);
              puVar41[1] = *(undefined2 *)((long)&A->data + lVar30 + uVar13 * 2);
              puVar41[2] = *(undefined2 *)((long)&A->data + lVar30 + lVar38 * 2);
              puVar41[3] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar15 * 2);
              puVar41[4] = *(undefined2 *)((long)&A->data + lVar30 + lVar42 * 2);
              puVar41[5] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar16 * 2);
              puVar41[6] = *(undefined2 *)((long)&A->data + lVar30 + lVar43 * 2);
              puVar41[7] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar17 * 2);
              puVar41[8] = *(undefined2 *)((long)&A->data + lVar30 + lVar40 * 2);
              puVar41[9] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar28 * 2);
              puVar41[10] = *(undefined2 *)((long)&A->data + lVar30 + lVar29 * 2);
              puVar41[0xb] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar18 * 2);
              puVar41[0xc] = *(undefined2 *)((long)&A->data + lVar30 + lVar20 * 2);
              puVar41[0xd] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar19 * 2);
              puVar41[0xe] = *(undefined2 *)((long)&A->data + lVar30 + lVar33 * 2);
              puVar41[0xf] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar37 * 2);
              puVar41[0x10] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar14 * 8) * 2);
              puVar41[0x11] =
                   *(undefined2 *)((long)&A->data + lVar30 + (long)(batch + iVar14 * 8) * 2);
              puVar41[0x12] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar4 * 2);
              puVar41[0x13] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar4 + batch) * 2);
              puVar41[0x14] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar5 * 2);
              puVar41[0x15] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar5 + batch) * 2);
              puVar41[0x16] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar11 * 2);
              puVar41[0x17] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar11 + batch) * 2);
              puVar41[0x18] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar6 * 2);
              puVar41[0x19] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar6 + batch) * 2);
              puVar41[0x1a] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar12 * 2);
              puVar41[0x1b] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar12 + batch) * 2);
              puVar41[0x1c] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar10 * 2);
              puVar41[0x1d] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar10 + batch) * 2);
              puVar41[0x1e] = *(undefined2 *)((long)&A->data + lVar30 + (long)iVar7 * 2);
              puVar41[0x1f] = *(undefined2 *)((long)&A->data + lVar30 + (long)(iVar7 + batch) * 2);
              puVar41 = puVar41 + 0x20;
              iVar24 = iVar24 + 2;
              lVar30 = lVar30 + lVar8;
            } while (iVar24 < max_kk);
            puVar31 = (undefined2 *)((long)&A->data + lVar30);
            uVar32 = uVar21;
          }
          iVar24 = max_kk - uVar32;
          if (iVar24 != 0 && (int)uVar32 <= max_kk) {
            do {
              *puVar41 = *puVar31;
              puVar41[1] = puVar31[lVar38];
              puVar41[2] = puVar31[lVar42];
              puVar41[3] = puVar31[lVar43];
              puVar41[4] = puVar31[lVar40];
              puVar41[5] = puVar31[lVar29];
              puVar41[6] = puVar31[lVar20];
              puVar41[7] = puVar31[lVar33];
              puVar41[8] = puVar31[iVar14 * 8];
              puVar41[9] = puVar31[iVar4];
              puVar41[10] = puVar31[iVar5];
              puVar41[0xb] = puVar31[iVar11];
              puVar41[0xc] = puVar31[iVar6];
              puVar41[0xd] = puVar31[iVar12];
              puVar41[0xe] = puVar31[iVar10];
              puVar41[0xf] = puVar31[iVar7];
              puVar41 = puVar41 + 0x10;
              puVar31 = puVar31 + uVar13;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar34 = local_2a0 + 0x10;
          lVar30 = local_2a0 + 0x1f;
          local_2a8 = local_2a8 + lVar38 * 0x20;
          local_2a0 = uVar34;
        } while (lVar30 < lVar39);
      }
      if ((int)((uint)uVar34 | 7) < max_ii) {
        uVar25 = uVar34 & 0xffffffff;
        lVar30 = lVar9 * uVar25;
        local_1e8 = local_270;
        uVar22 = uVar25;
        do {
          if (max_kk < 2) {
            uVar32 = 0;
            puVar31 = (undefined2 *)((long)&A->data + uVar22 * lVar38 * 2 + uVar27 * 2);
          }
          else {
            iVar24 = 1;
            lVar35 = local_1e8;
            do {
              *puVar41 = *(undefined2 *)((long)&A->data + lVar35 + lVar30);
              puVar41[1] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + uVar13 * 2);
              puVar41[2] = *(undefined2 *)((long)&A->data + lVar35 + (uVar25 * 2 + 2) * lVar38);
              puVar41[3] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar15 * 2);
              puVar41[4] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar42 * 2);
              puVar41[5] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar16 * 2);
              puVar41[6] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar43 * 2);
              puVar41[7] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar17 * 2);
              puVar41[8] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar40 * 2);
              puVar41[9] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar28 * 2);
              puVar41[10] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar29 * 2);
              puVar41[0xb] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar18 * 2);
              puVar41[0xc] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar20 * 2);
              puVar41[0xd] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar19 * 2);
              puVar41[0xe] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + lVar33 * 2);
              puVar41[0xf] = *(undefined2 *)((long)&A->data + lVar35 + lVar30 + (long)iVar37 * 2);
              puVar41 = puVar41 + 0x10;
              iVar24 = iVar24 + 2;
              lVar35 = lVar35 + lVar8;
            } while (iVar24 < max_kk);
            puVar31 = (undefined2 *)((long)&A->data + lVar35 + lVar30);
            uVar32 = uVar21;
          }
          iVar24 = max_kk - uVar32;
          if (iVar24 != 0 && (int)uVar32 <= max_kk) {
            do {
              *puVar41 = *puVar31;
              puVar41[1] = puVar31[lVar38];
              puVar41[2] = puVar31[lVar42];
              puVar41[3] = puVar31[lVar43];
              puVar41[4] = puVar31[lVar40];
              puVar41[5] = puVar31[lVar29];
              puVar41[6] = puVar31[lVar20];
              puVar41[7] = puVar31[lVar33];
              puVar41 = puVar41 + 8;
              puVar31 = puVar31 + uVar13;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar34 = uVar22 + 8;
          lVar35 = uVar22 + 0xf;
          local_1e8 = local_1e8 + lVar38 * 0x10;
          uVar22 = uVar34;
        } while (lVar35 < lVar39);
      }
      if ((int)((uint)uVar34 | 3) < max_ii) {
        uVar25 = uVar34 & 0xffffffff;
        lVar35 = lVar9 * uVar25;
        lVar30 = local_270;
        uVar22 = uVar25;
        do {
          if (max_kk < 2) {
            uVar32 = 0;
            puVar31 = (undefined2 *)((long)&A->data + uVar22 * lVar38 * 2 + uVar27 * 2);
          }
          else {
            iVar24 = 1;
            lVar36 = lVar30;
            do {
              *puVar41 = *(undefined2 *)((long)&A->data + lVar36 + lVar35);
              puVar41[1] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + uVar13 * 2);
              puVar41[2] = *(undefined2 *)((long)&A->data + lVar36 + (uVar25 * 2 + 2) * lVar38);
              puVar41[3] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + (long)iVar15 * 2);
              puVar41[4] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + lVar42 * 2);
              puVar41[5] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + (long)iVar16 * 2);
              puVar41[6] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + lVar43 * 2);
              puVar41[7] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + (long)iVar17 * 2);
              puVar41 = puVar41 + 8;
              iVar24 = iVar24 + 2;
              lVar36 = lVar36 + lVar8;
            } while (iVar24 < max_kk);
            puVar31 = (undefined2 *)((long)&A->data + lVar36 + lVar35);
            uVar32 = uVar21;
          }
          iVar24 = max_kk - uVar32;
          if (iVar24 != 0 && (int)uVar32 <= max_kk) {
            do {
              *puVar41 = *puVar31;
              puVar41[1] = puVar31[lVar38];
              puVar41[2] = puVar31[lVar42];
              puVar41[3] = puVar31[lVar43];
              puVar41 = puVar41 + 4;
              puVar31 = puVar31 + uVar13;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar34 = uVar22 + 4;
          lVar36 = uVar22 + 7;
          lVar30 = lVar30 + lVar38 * 8;
          uVar22 = uVar34;
        } while (lVar36 < lVar39);
      }
      if ((int)((uint)uVar34 | 1) < max_ii) {
        uVar25 = (ulong)(int)(uint)uVar34;
        lVar35 = lVar9 * uVar25;
        uVar22 = uVar25;
        lVar30 = local_270;
        do {
          if (max_kk < 2) {
            uVar32 = 0;
            puVar31 = (undefined2 *)((long)&A->data + uVar22 * lVar38 * 2 + uVar27 * 2);
          }
          else {
            iVar24 = 1;
            lVar36 = lVar30;
            do {
              *puVar41 = *(undefined2 *)((long)&A->data + lVar36 + lVar35);
              puVar41[1] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + uVar13 * 2);
              puVar41[2] = *(undefined2 *)((long)&A->data + lVar36 + (uVar25 * 2 + 2) * lVar38);
              puVar41[3] = *(undefined2 *)((long)&A->data + lVar36 + lVar35 + (long)iVar15 * 2);
              puVar41 = puVar41 + 4;
              iVar24 = iVar24 + 2;
              lVar36 = lVar36 + lVar8;
            } while (iVar24 < max_kk);
            puVar31 = (undefined2 *)((long)&A->data + lVar36 + lVar35);
            uVar32 = uVar21;
          }
          iVar24 = max_kk - uVar32;
          if (iVar24 != 0 && (int)uVar32 <= max_kk) {
            do {
              *puVar41 = *puVar31;
              puVar41[1] = puVar31[lVar38];
              puVar41 = puVar41 + 2;
              puVar31 = puVar31 + uVar13;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar34 = uVar22 + 2;
          lVar36 = uVar22 + 3;
          lVar30 = lVar30 + lVar38 * 4;
          uVar22 = uVar34;
        } while (lVar36 < lVar39);
      }
      if ((int)uVar34 < max_ii) {
        lVar30 = (long)(int)uVar34;
        ppvVar23 = (void **)((long)&local_1d0->data + lVar9 * lVar30);
        do {
          ppvVar26 = ppvVar23;
          iVar24 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar41 = *(undefined2 *)ppvVar26;
              puVar41 = puVar41 + 1;
              iVar24 = iVar24 + -1;
              ppvVar26 = (void **)((long)ppvVar26 + uVar13 * 2);
            } while (iVar24 != 0);
          }
          lVar30 = lVar30 + 1;
          ppvVar23 = (void **)((long)ppvVar23 + lVar9);
        } while (lVar30 != lVar39);
      }
      uVar27 = uVar27 + 1;
      local_270 = local_270 + 2;
      local_1d0 = (Mat *)((long)&local_1d0->data + 2);
    } while (uVar27 != uVar13);
  }
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        short* pp = AT.row<short>(b);

        int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                pp[16] = p0[N * 8];
                pp[17] = p0[N * 8 + batch];
                pp[18] = p0[N * 9];
                pp[19] = p0[N * 9 + batch];
                pp[20] = p0[N * 10];
                pp[21] = p0[N * 10 + batch];
                pp[22] = p0[N * 11];
                pp[23] = p0[N * 11 + batch];
                pp[24] = p0[N * 12];
                pp[25] = p0[N * 12 + batch];
                pp[26] = p0[N * 13];
                pp[27] = p0[N * 13 + batch];
                pp[28] = p0[N * 14];
                pp[29] = p0[N * 14 + batch];
                pp[30] = p0[N * 15];
                pp[31] = p0[N * 15 + batch];
                p0 += batch * 2;
                pp += 32;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                pp[8] = p0[N * 8];
                pp[9] = p0[N * 9];
                pp[10] = p0[N * 10];
                pp[11] = p0[N * 11];
                pp[12] = p0[N * 12];
                pp[13] = p0[N * 13];
                pp[14] = p0[N * 14];
                pp[15] = p0[N * 15];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                p0 += batch * 2;
                pp += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX2__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                p0 += batch * 2;
                pp += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                p0 += batch * 2;
                pp += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}